

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppEmitter.cpp
# Opt level: O3

void __thiscall
calc4::anon_unknown_0::Visitor<__int128>::Visit
          (Visitor<__int128> *this,shared_ptr<const_calc4::UserDefinedOperator> *op)

{
  _Optional_payload_base<bool> _Var1;
  element_type *peVar2;
  _func_int *p_Var3;
  shared_ptr<const_calc4::Operator> *op_00;
  OperatorDefinition *other;
  undefined8 uVar4;
  char *pcVar5;
  size_type sVar6;
  Visitor<__int128> *this_00;
  long lVar7;
  long lVar8;
  bool bVar9;
  int iVar10;
  ostream *poVar11;
  long lVar12;
  ulong uVar13;
  undefined8 uStack_60;
  int aiStack_58 [2];
  undefined1 local_50 [8];
  vector<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
  operands;
  
  peVar2 = (op->super___shared_ptr<const_calc4::UserDefinedOperator,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  lVar7 = -((long)(peVar2->definition).numOperands * 4 + 0xfU & 0xfffffffffffffff0);
  lVar8 = lVar7 + -0x58;
  p_Var3 = (peVar2->super_Operator)._vptr_Operator[1];
  *(undefined8 *)((long)&uStack_60 + lVar7) = 0x11ba44;
  (*p_Var3)(local_50);
  if ((undefined1  [8])
      operands.
      super__Vector_base<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
      ._M_impl.super__Vector_impl_data._M_start != local_50) {
    lVar12 = 0;
    uVar13 = 0;
    do {
      op_00 = *(shared_ptr<const_calc4::Operator> **)
               ((long)&((__shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2> *)local_50)
                       ->_M_ptr + lVar12);
      *(undefined8 *)((long)&uStack_60 + lVar7) = 0x11ba61;
      iVar10 = ProcessOperator(this,op_00);
      *(int *)((long)aiStack_58 + uVar13 * 4 + lVar8 + 0x58) = iVar10;
      uVar13 = uVar13 + 1;
      lVar12 = lVar12 + 0x10;
    } while (uVar13 < (ulong)((long)operands.
                                    super__Vector_base<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start - (long)local_50 >> 4)
            );
  }
  peVar2 = (op->super___shared_ptr<const_calc4::UserDefinedOperator,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  _Var1 = (peVar2->isTailCall).super__Optional_base<bool,_true,_true>._M_payload.
          super__Optional_payload_base<bool>;
  if (((ushort)_Var1 >> 8 & 1 & (ushort)_Var1) != 0) {
    other = this->definition;
    *(undefined8 *)((long)&uStack_60 + lVar7) = 0x11baa5;
    bVar9 = OperatorDefinition::operator==(&peVar2->definition,other);
    if (bVar9) {
      if (0 < (int)((ulong)((long)operands.
                                  super__Vector_base<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start - (long)local_50) >> 4))
      {
        lVar12 = 0;
        do {
          *(undefined8 *)((long)&uStack_60 + lVar7) = 0x11bacc;
          poVar11 = Append(this);
          *(undefined8 *)((long)&uStack_60 + lVar7) = 0x11bae3;
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"arg_",4);
          *(undefined8 *)((long)&uStack_60 + lVar7) = 0x11baee;
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,(int)lVar12);
          *(undefined8 *)((long)&uStack_60 + lVar7) = 0x11bb05;
          std::__ostream_insert<char,std::char_traits<char>>(poVar11," = ",3);
          iVar10 = *(int *)((long)aiStack_58 + lVar12 * 4 + lVar8 + 0x58);
          *(undefined8 *)((long)&uStack_60 + lVar7) = 0x11bb1d;
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"var_",4);
          *(undefined8 *)((long)&uStack_60 + lVar7) = 0x11bb28;
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar10);
          operands.
          super__Vector_base<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = 0x3b;
          *(undefined8 *)((long)&uStack_60 + lVar7) = 0x11bb3d;
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar11,(char *)((long)&operands.
                                                  super__Vector_base<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                               + 4),1);
          uVar4 = *(undefined8 *)(*(long *)poVar11 + -0x18);
          *(undefined8 *)((long)&uStack_60 + lVar7) = 0x11bb54;
          std::ios::widen((char)uVar4 + (char)poVar11);
          *(undefined8 *)((long)&uStack_60 + lVar7) = 0x11bb5f;
          std::ostream::put((char)poVar11);
          *(undefined8 *)((long)&uStack_60 + lVar7) = 0x11bb67;
          std::ostream::flush();
          lVar12 = lVar12 + 1;
        } while (lVar12 < (int)((ulong)((long)operands.
                                              super__Vector_base<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start -
                                       (long)local_50) >> 4));
      }
      *(undefined8 *)((long)&uStack_60 + lVar7) = 0x11bb89;
      poVar11 = Append(this);
      *(undefined8 *)((long)&uStack_60 + lVar7) = 0x11bba0;
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"goto ",5);
      *(undefined8 *)((long)&uStack_60 + lVar7) = 0x11bbb4;
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,"Entry",5);
      operands.
      super__Vector_base<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = 0x3b;
      *(undefined8 *)((long)&uStack_60 + lVar7) = 0x11bbc8;
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11,(char *)((long)&operands.
                                                  super__Vector_base<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                           + 4),1);
      uVar4 = *(undefined8 *)(*(long *)poVar11 + -0x18);
      *(undefined8 *)((long)&uStack_60 + lVar7) = 0x11bbdf;
      std::ios::widen((char)uVar4 + (char)poVar11);
      *(undefined8 *)((long)&uStack_60 + lVar7) = 0x11bbea;
      std::ostream::put((char)poVar11);
      *(undefined8 *)((long)&uStack_60 + lVar7) = 0x11bbf2;
      std::ostream::flush();
      operands.
      super__Vector_base<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = -1;
      *(undefined8 *)((long)&uStack_60 + lVar7) = 0x11bc08;
      std::deque<int,_std::allocator<int>_>::emplace_back<int>
                (&(this->stack).c,
                 (int *)((long)&operands.
                                super__Vector_base<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      goto LAB_0011bce9;
    }
  }
  *(undefined8 *)((long)&uStack_60 + lVar7) = 0x11bc15;
  AppendVariableDeclarationBegin(this);
  poVar11 = this->os;
  peVar2 = (op->super___shared_ptr<const_calc4::UserDefinedOperator,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  *(undefined8 *)((long)&uStack_60 + lVar7) = 0x11bc30;
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"user_defined_operator_",0x16);
  pcVar5 = (peVar2->definition).name._M_dataplus._M_p;
  sVar6 = (peVar2->definition).name._M_string_length;
  *(undefined8 *)((long)&uStack_60 + lVar7) = 0x11bc40;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar5,sVar6);
  operands.
  super__Vector_base<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = 0x28;
  *(undefined8 *)((long)&uStack_60 + lVar7) = 0x11bc54;
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,(char *)((long)&operands.
                                     super__Vector_base<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),1);
  if ((undefined1  [8])
      operands.
      super__Vector_base<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
      ._M_impl.super__Vector_impl_data._M_start != local_50) {
    uVar13 = 0;
    do {
      if (uVar13 != 0) {
        poVar11 = this->os;
        *(undefined8 *)((long)&uStack_60 + lVar7) = 0x11bc7b;
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,", ",2);
      }
      poVar11 = this->os;
      iVar10 = *(int *)((long)aiStack_58 + uVar13 * 4 + lVar8 + 0x58);
      *(undefined8 *)((long)&uStack_60 + lVar7) = 0x11bc97;
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"var_",4);
      *(undefined8 *)((long)&uStack_60 + lVar7) = 0x11bca2;
      std::ostream::operator<<(poVar11,iVar10);
      uVar13 = uVar13 + 1;
    } while (uVar13 < (ulong)((long)operands.
                                    super__Vector_base<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start - (long)local_50 >> 4)
            );
  }
  poVar11 = this->os;
  operands.
  super__Vector_base<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = 0x29;
  *(undefined8 *)((long)&uStack_60 + lVar7) = 0x11bccb;
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,(char *)((long)&operands.
                                     super__Vector_base<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),1);
  this_00 = (Visitor<__int128> *)this->os;
  *(undefined8 *)((long)&uStack_60 + lVar7) = 0x11bcd4;
  AppendVariableDeclarationEnd(this_00);
  operands.
  super__Vector_base<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = this->lastVariableNo;
  *(undefined8 *)((long)&uStack_60 + lVar7) = 0x11bce9;
  std::deque<int,_std::allocator<int>_>::emplace_back<int>
            (&(this->stack).c,
             (int *)((long)&operands.
                            super__Vector_base<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
LAB_0011bce9:
  *(undefined8 *)((long)&uStack_60 + lVar7) = 0x11bcf2;
  std::
  vector<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
  ::~vector((vector<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
             *)local_50);
  return;
}

Assistant:

virtual void Visit(const std::shared_ptr<const UserDefinedOperator>& op) override
    {
        int* operandVariableNos =
            reinterpret_cast<int*>(alloca(sizeof(int) * op->GetDefinition().GetNumOperands()));

        auto operands = op->GetOperands();
        for (size_t i = 0; i < operands.size(); i++)
        {
            operandVariableNos[i] = ProcessOperator(operands[i]);
        }

        if (op->IsTailCall().value_or(false) && op->GetDefinition() == this->definition)
        {
            for (int i = 0; i < static_cast<int>(operands.size()); i++)
            {
                Append() << ArgumentName(i) << " = " << VariableName(operandVariableNos[i]) << ';'
                         << std::endl;
            }

            Append() << "goto " << OperatorEntryLabel() << ';' << std::endl;
            Return(-1);
        }
        else
        {
            AppendVariableDeclarationBegin();
            os << UserDefinedOperatorName(op->GetDefinition()) << '(';
            for (size_t i = 0; i < operands.size(); i++)
            {
                if (i > 0)
                {
                    os << ", ";
                }

                os << VariableName(operandVariableNos[i]);
            }
            os << ')';
            AppendVariableDeclarationEnd();
            Return();
        }
    }